

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *p,int iFraigObj)

{
  sat_solver *psVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  
  iVar3 = Ssc_ObjSatVar(p,iFraigObj);
  if (iVar3 == 0) {
    pGVar6 = Gia_ManObj(p->pFraig,iFraigObj);
    uVar4 = (uint)*(undefined8 *)pGVar6;
    if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscCore.c"
                    ,0xab,"int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *, int)");
    }
    uVar4 = Ssc_GiaSimulatePatternFraig_rec(p,iFraigObj - (uVar4 & 0x1fffffff));
    uVar5 = Ssc_GiaSimulatePatternFraig_rec
                      (p,iFraigObj - (*(uint *)&pGVar6->field_0x4 & 0x1fffffff));
    uVar2 = *(ulong *)pGVar6;
    uVar4 = ((uint)(uVar2 >> 0x3d) & 1 ^ uVar5) & ((uint)(uVar2 >> 0x1d) & 7 ^ uVar4);
    *(ulong *)pGVar6 = uVar2 & 0xffffffffbfffffff | (ulong)(uVar4 << 0x1e);
  }
  else {
    psVar1 = p->pSat;
    uVar4 = Ssc_ObjSatVar(p,iFraigObj);
    if (((int)uVar4 < 0) || (psVar1->size <= (int)uVar4)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    uVar4 = (uint)(psVar1->model[uVar4] == 1);
  }
  return uVar4;
}

Assistant:

int Ssc_GiaSimulatePatternFraig_rec( Ssc_Man_t * p, int iFraigObj )
{
    Gia_Obj_t * pObj;
    int Res0, Res1;
    if ( Ssc_ObjSatVar(p, iFraigObj) )
        return sat_solver_var_value( p->pSat, Ssc_ObjSatVar(p, iFraigObj) );
    pObj = Gia_ManObj( p->pFraig, iFraigObj );
    assert( Gia_ObjIsAnd(pObj) );
    Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId0(pObj, iFraigObj) );
    Res1 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId1(pObj, iFraigObj) );
    pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    return pObj->fMark0;
}